

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O3

void cftbsub(int n,double *a,double *w)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  ulong uVar4;
  uint l;
  ulong uVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  uVar6 = 2;
  if (8 < n) {
    cft1st(n,a,w);
    uVar6 = 8;
    if (0x20 < (uint)n) {
      uVar3 = 0x20;
      l = 8;
      do {
        uVar6 = uVar3;
        cftmdl(n,l,a,w);
        uVar3 = uVar6 * 4;
        l = uVar6;
      } while ((int)(uVar6 * 4) < n);
    }
  }
  if (uVar6 * 4 == n) {
    if (0 < (int)uVar6) {
      uVar4 = (ulong)uVar6;
      uVar5 = 0;
      do {
        dVar12 = a[uVar4 * 2 + uVar5];
        dVar13 = (a + uVar4 * 2 + uVar5)[1];
        dVar1 = a[uVar4 * 3 + uVar5];
        dVar2 = (a + uVar4 * 3 + uVar5)[1];
        dVar7 = dVar12 - dVar1;
        dVar8 = dVar13 - dVar2;
        dVar10 = a[uVar4 + uVar5];
        dVar9 = (a + uVar4 + uVar5)[1];
        dVar11 = a[uVar5] + dVar10;
        dVar14 = -a[uVar5 + 1] - dVar9;
        dVar9 = dVar9 - a[uVar5 + 1];
        dVar10 = a[uVar5] - dVar10;
        dVar12 = dVar12 + dVar1;
        dVar13 = dVar13 + dVar2;
        a[uVar5] = dVar11 + dVar12;
        (a + uVar5)[1] = dVar14 - dVar13;
        a[uVar4 * 2 + uVar5] = dVar11 - dVar12;
        (a + uVar4 * 2 + uVar5)[1] = dVar14 + dVar13;
        a[uVar4 + uVar5] = dVar10 - dVar8;
        (a + uVar4 + uVar5)[1] = dVar9 - dVar7;
        a[uVar4 * 3 + uVar5] = dVar10 + dVar8;
        (a + uVar4 * 3 + uVar5)[1] = dVar9 + dVar7;
        uVar5 = uVar5 + 2;
      } while (uVar5 < uVar4);
    }
  }
  else if (0 < (int)uVar6) {
    uVar4 = (ulong)uVar6;
    uVar5 = 0;
    do {
      dVar12 = a[uVar5];
      dVar13 = a[uVar4 + uVar5];
      dVar1 = a[uVar4 + uVar5 + 1];
      a[uVar5] = dVar12 + dVar13;
      dVar2 = a[uVar5 + 1];
      a[uVar5 + 1] = -dVar2 - a[uVar4 + uVar5 + 1];
      a[uVar4 + uVar5] = dVar12 - dVar13;
      (a + uVar4 + uVar5)[1] = dVar1 - dVar2;
      uVar5 = uVar5 + 2;
    } while (uVar5 < uVar4);
  }
  return;
}

Assistant:

void cftbsub(int n, double *a, double *w)
{
    void cft1st(int n, double *a, double *w);
    void cftmdl(int n, int l, double *a, double *w);
    int j, j1, j2, j3, l;
    double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;
    
    l = 2;
    if (n > 8) {
        cft1st(n, a, w);
        l = 8;
        while ((l << 2) < n) {
            cftmdl(n, l, a, w);
            l <<= 2;
        }
    }
    if ((l << 2) == n) {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = -a[j + 1] - a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = -a[j + 1] + a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i - x2i;
            a[j2] = x0r - x2r;
            a[j2 + 1] = x0i + x2i;
            a[j1] = x1r - x3i;
            a[j1 + 1] = x1i - x3r;
            a[j3] = x1r + x3i;
            a[j3 + 1] = x1i + x3r;
        }
    } else {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            x0r = a[j] - a[j1];
            x0i = -a[j + 1] + a[j1 + 1];
            a[j] += a[j1];
            a[j + 1] = -a[j + 1] - a[j1 + 1];
            a[j1] = x0r;
            a[j1 + 1] = x0i;
        }
    }
}